

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O3

void __thiscall SAT::addClause(SAT *this,vec<Lit> *ps,bool one_watch)

{
  char cVar1;
  uint uVar2;
  Lit *pLVar3;
  char *pcVar4;
  lbool lVar5;
  lbool lVar6;
  uint uVar7;
  Clause *this_00;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  char cVar11;
  
  lVar6.value = ::l_Undef.value;
  lVar5.value = ::l_True.value;
  uVar8 = ps->sz;
  if (uVar8 != 0) {
    pLVar3 = ps->data;
    pcVar4 = (this->assigns).data;
    uVar10 = 0;
    uVar7 = 0;
    do {
      uVar2 = pLVar3[uVar10].x;
      cVar1 = pcVar4[(uint)((int)uVar2 >> 1)];
      cVar11 = -cVar1;
      if ((uVar2 & 1) == 0) {
        cVar11 = cVar1;
      }
      if (cVar11 == lVar5.value) {
        return;
      }
      if (cVar11 == lVar6.value) {
        uVar9 = (ulong)uVar7;
        uVar7 = uVar7 + 1;
        pLVar3[uVar9].x = uVar2;
        uVar8 = ps->sz;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < uVar8);
    ps->sz = uVar7;
    if (uVar7 != 0) {
      this_00 = (Clause *)malloc((ulong)(uVar7 - 1) * 4 + 8);
      Clause::Clause<vec<Lit>>(this_00,ps,false);
      addClause(this,this_00,one_watch);
      return;
    }
  }
  puts("=====UNSATISFIABLE=====");
  printf("%% Top level failure!\n");
  exit(0);
}

Assistant:

void SAT::addClause(vec<Lit>& ps, bool one_watch) {
	unsigned int i;
	unsigned int j;
	for (i = j = 0; i < ps.size(); i++) {
		if (value(ps[i]) == l_True) {
			return;
		}
		if (value(ps[i]) == l_Undef) {
			ps[j++] = ps[i];
		}
	}
	ps.resize(j);
	if (ps.size() == 0) {
		assert(false);
		TL_FAIL();
	}
	addClause(*Clause_new(ps), one_watch);
}